

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorypool.h
# Opt level: O1

void __thiscall
despot::MemoryPool<despot::SimpleState>::Free
          (MemoryPool<despot::SimpleState> *this,SimpleState *obj)

{
  pointer *pppSVar1;
  iterator __position;
  SimpleState *local_10;
  
  local_10 = obj;
  if (obj->field_0x8 != '\0') {
    obj->field_0x8 = 0;
    __position._M_current =
         (this->freelist_).
         super__Vector_base<despot::SimpleState_*,_std::allocator<despot::SimpleState_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->freelist_).
        super__Vector_base<despot::SimpleState_*,_std::allocator<despot::SimpleState_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<despot::SimpleState*,std::allocator<despot::SimpleState*>>::
      _M_realloc_insert<despot::SimpleState*const&>
                ((vector<despot::SimpleState*,std::allocator<despot::SimpleState*>> *)
                 &this->freelist_,__position,&local_10);
    }
    else {
      *__position._M_current = obj;
      pppSVar1 = &(this->freelist_).
                  super__Vector_base<despot::SimpleState_*,_std::allocator<despot::SimpleState_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppSVar1 = *pppSVar1 + 1;
    }
    this->num_allocated_ = this->num_allocated_ + -1;
    return;
  }
  __assert_fail("obj->IsAllocated()",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/include/despot/util/memorypool.h"
                ,0x3b,
                "void despot::MemoryPool<despot::SimpleState>::Free(T *) [T = despot::SimpleState]")
  ;
}

Assistant:

void Free(T* obj) {
		assert(obj->IsAllocated());
		obj->ClearAllocated();
		freelist_.push_back(obj);
		num_allocated_--;
	}